

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

UnlockStatus __thiscall CategoriesMutex::unlock(CategoriesMutex *this)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  CategoriesMutex *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->internal_);
  if (this->count_ == 0) {
    this_local._4_4_ = ALREADY_UNLOCKED;
  }
  else {
    this->count_ = this->count_ + -1;
    if (this->count_ == 0) {
      this->current_category_ = -1;
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
    std::condition_variable::notify_all();
    this_local._4_4_ = UNLOCK_SUCCESS;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return this_local._4_4_;
}

Assistant:

UnlockStatus unlock() {
        std::unique_lock lock(internal_);
        if (count_ == 0) {
            return ALREADY_UNLOCKED;
        }
        --count_;
        if (count_ == 0) {
            current_category_ = -1;
        }

        lock.unlock();
        cv.notify_all();
        return UNLOCK_SUCCESS;
    }